

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::samplerCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier,TIntermTyped *param_4
          )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mapped_type *pmVar5;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined **ppuVar6;
  char *pcVar7;
  long lVar8;
  pointer pcVar9;
  _func_int **pp_Var10;
  TString TStack_58;
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if ((iVar2 == 0xe) &&
     (iVar2 = (*type->_vptr_TType[8])(type),
     (*(byte *)(CONCAT44(extraout_var,iVar2) + 3) & 0x20) != 0)) {
    ppuVar6 = &E_GL_OES_EGL_image_external_essl3;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 300) {
      ppuVar6 = &E_GL_OES_EGL_image_external;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,ppuVar6,"samplerExternalOES");
  }
  iVar2 = (*type->_vptr_TType[8])(type);
  if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 3) & 0x40) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_YUV_target,"__samplerExternal2DY2YEXT");
  }
  iVar2 = (*type->_vptr_TType[0xb])(type);
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0x7f) == 5) {
    return;
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if ((iVar2 == 0xf) && (bVar1 = containsFieldWithBasicType(this,type,EbtSampler), bVar1)) {
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_bindless_texture");
    if ((char)iVar2 == '\0') {
      TType::getBasicTypeString_abi_cxx11_(&TStack_58,type);
      pcVar9 = (identifier->_M_dataplus)._M_p;
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "non-uniform struct contains a sampler or image:";
LAB_00429622:
      (*pp_Var10[0x2d])(this,loc,pcVar7,TStack_58._M_dataplus._M_p,pcVar9);
      return;
    }
    iVar2 = (*type->_vptr_TType[8])(type);
    uVar4 = *(uint *)CONCAT44(extraout_var_02,iVar2);
  }
  else {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 != 0xe) {
      return;
    }
    iVar2 = (*type->_vptr_TType[0xb])(type);
    if ((*(uint *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f) == 5) {
      return;
    }
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_bindless_texture");
    iVar3 = (*type->_vptr_TType[8])(type);
    uVar4 = *(uint *)CONCAT44(extraout_var_04,iVar3);
    if ((char)iVar2 == '\0') {
      if (((uVar4 & 0xff00) == 0x800) &&
         (iVar2 = (*type->_vptr_TType[0xb])(type),
         (*(uint *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x7f) != 0x1f)) {
        TType::getBasicTypeString_abi_cxx11_(&TStack_58,type);
        pcVar9 = (identifier->_M_dataplus)._M_p;
        pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar7 = "can only be used in tileImageEXT variables or function parameters:";
      }
      else {
        iVar2 = (*type->_vptr_TType[0xb])(type);
        if ((*(uint *)(CONCAT44(extraout_var_06,iVar2) + 8) & 0x7f) == 0x1f) {
          return;
        }
        TType::getBasicTypeString_abi_cxx11_(&TStack_58,type);
        pcVar9 = (identifier->_M_dataplus)._M_p;
        pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar7 = "sampler/image types can only be used in uniform variables or function parameters:"
        ;
      }
      goto LAB_00429622;
    }
  }
  if ((((uVar4 >> 0x13 & 1) == 0) || ((uVar4 & 0xff00) == 0x700)) || ((uVar4 & 0xff00) == 0x800)) {
    lVar8 = 0x528;
  }
  else {
    lVar8 = 0x558;
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                         *)((long)&((this->super_TParseContextBase).super_TParseVersions.
                                   intermediate)->language + lVar8),&this->currentCaller);
  *pmVar5 = AstRefTypeVar;
  return;
}

Assistant:

void TParseContext::samplerCheck(const TSourceLoc& loc, const TType& type, const TString& identifier, TIntermTyped* /*initializer*/)
{
    // Check that the appropriate extension is enabled if external sampler is used.
    // There are two extensions. The correct one must be used based on GLSL version.
    if (type.getBasicType() == EbtSampler && type.getSampler().isExternal()) {
        if (version < 300) {
            requireExtensions(loc, 1, &E_GL_OES_EGL_image_external, "samplerExternalOES");
        } else {
            requireExtensions(loc, 1, &E_GL_OES_EGL_image_external_essl3, "samplerExternalOES");
        }
    }
    if (type.getSampler().isYuv()) {
        requireExtensions(loc, 1, &E_GL_EXT_YUV_target, "__samplerExternal2DY2YEXT");
    }

    if (type.getQualifier().storage == EvqUniform)
        return;

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtSampler)) {
        // For bindless texture, sampler can be declared as an struct member
        if (extensionTurnedOn(E_GL_ARB_bindless_texture)) {
            if (type.getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeVar);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeVar);
        }
        else {
            error(loc, "non-uniform struct contains a sampler or image:", type.getBasicTypeString().c_str(), identifier.c_str());
        }
    }
    else if (type.getBasicType() == EbtSampler && type.getQualifier().storage != EvqUniform) {
        // For bindless texture, sampler can be declared as an input/output/block member
        if (extensionTurnedOn(E_GL_ARB_bindless_texture)) {
            if (type.getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeVar);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeVar);
        }
        else {
            // non-uniform sampler
            // not yet:  okay if it has an initializer
            // if (! initializer)
            if (type.getSampler().isAttachmentEXT() && type.getQualifier().storage != EvqTileImageEXT)
                 error(loc, "can only be used in tileImageEXT variables or function parameters:", type.getBasicTypeString().c_str(), identifier.c_str());
             else if (type.getQualifier().storage != EvqTileImageEXT)
                 error(loc, "sampler/image types can only be used in uniform variables or function parameters:", type.getBasicTypeString().c_str(), identifier.c_str());
        }
    }
}